

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wstring * fmt::v5::to_string<wchar_t,500ul>
                    (basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *buf)

{
  wchar_t *pwVar1;
  size_t sVar2;
  basic_buffer<wchar_t> *in_RSI;
  wstring *in_RDI;
  allocator local_11;
  basic_buffer<wchar_t> *local_10;
  
  local_10 = in_RSI;
  pwVar1 = internal::basic_buffer<wchar_t>::data(in_RSI);
  sVar2 = internal::basic_buffer<wchar_t>::size(local_10);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring(in_RDI,pwVar1,sVar2,&local_11);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_11);
  return in_RDI;
}

Assistant:

std::basic_string<Char> to_string(const basic_memory_buffer<Char, SIZE> &buf) {
  return std::basic_string<Char>(buf.data(), buf.size());
}